

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StringNew * __thiscall MixedArena::alloc<wasm::StringNew>(MixedArena *this)

{
  StringNew *pSVar1;
  
  pSVar1 = (StringNew *)allocSpace(this,0x30,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression._id = StringNewId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)82>).super_Expression.type.id = 0;
  pSVar1->start = (Expression *)0x0;
  pSVar1->end = (Expression *)0x0;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }